

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void remove_dot_segments(char *inout)

{
  int iVar1;
  char cVar2;
  char *out_end;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  
  pcVar3 = inout;
  if (inout == (char *)0x0) {
    return;
  }
  do {
    if (*pcVar3 == '\\') {
      *pcVar3 = '/';
    }
    else if (*pcVar3 == '\0') break;
    pcVar3 = pcVar3 + 1;
  } while( true );
  cVar2 = *inout;
  pcVar3 = inout;
  pcVar4 = inout;
joined_r0x0011fd73:
  do {
    if (cVar2 == '\0') {
LAB_0011feb9:
      *pcVar4 = '\0';
      pcVar3 = inout;
      pcVar4 = inout;
      while( true ) {
        while (pcVar5 = pcVar4, cVar2 = *pcVar3, cVar2 == '.') {
          __n = 0;
          do {
            cVar2 = pcVar3[__n + 1];
            __n = __n + 1;
          } while (cVar2 == '.');
          if (cVar2 == '\0') {
            pcVar3 = pcVar3 + __n;
            pcVar4 = pcVar5;
          }
          else if (cVar2 == '/') {
            pcVar3 = pcVar3 + __n;
            pcVar4 = inout;
            if ((pcVar5 != inout) && (pcVar4 = pcVar5 + -1, pcVar5[-1] != '/')) {
              pcVar4 = pcVar5;
            }
          }
          else {
            memset(pcVar5,0x2e,__n);
            pcVar3 = pcVar3 + __n;
            pcVar4 = pcVar5 + __n;
          }
        }
        if (cVar2 == '\0') break;
        if (cVar2 == '/') {
          *pcVar5 = '/';
          do {
            pcVar4 = pcVar3 + 1;
            pcVar3 = pcVar3 + 1;
          } while (*pcVar4 == '/');
          pcVar4 = pcVar5 + 1;
        }
        else {
          *pcVar5 = cVar2;
          pcVar3 = pcVar3 + 1;
          pcVar4 = pcVar5 + 1;
        }
      }
      *pcVar5 = '\0';
      return;
    }
    if (cVar2 == '.') {
      if ((pcVar3[1] == '.') && (pcVar3[2] == '/')) {
        pcVar3 = pcVar3 + 3;
      }
      else {
        if (pcVar3[1] != '/') goto LAB_0011fdf3;
        pcVar3 = pcVar3 + 2;
      }
LAB_0011feac:
      cVar2 = *pcVar3;
      goto joined_r0x0011fd73;
    }
    if (cVar2 == '/') {
      if ((pcVar3[1] == '.') && (pcVar3[2] == '/')) {
        pcVar3 = pcVar3 + 2;
        cVar2 = '/';
        goto joined_r0x0011fd73;
      }
      if ((pcVar3[1] == '.') && (pcVar3[2] == '\0')) {
        pcVar3[1] = '\0';
        goto LAB_0011feac;
      }
    }
LAB_0011fdf3:
    iVar1 = strncmp(pcVar3,"/../",4);
    if (iVar1 == 0) {
      pcVar3 = pcVar3 + 3;
      if (pcVar4 != inout) {
        pcVar5 = pcVar4 + -1;
        do {
          pcVar4 = inout;
          if (pcVar5 == inout) goto LAB_0011feac;
          pcVar4 = pcVar5 + -1;
          cVar2 = *pcVar5;
          pcVar5 = pcVar4;
        } while (cVar2 != '/');
LAB_0011fe99:
        pcVar4 = pcVar4 + 1;
      }
      goto LAB_0011feac;
    }
    iVar1 = strcmp(pcVar3,"/..");
    if (iVar1 == 0) {
      pcVar3[1] = '\0';
      if (pcVar4 != inout) {
        pcVar5 = pcVar4 + -1;
        do {
          pcVar4 = inout;
          if (pcVar5 == inout) goto LAB_0011feac;
          pcVar4 = pcVar5 + -1;
          cVar2 = *pcVar5;
          pcVar5 = pcVar4;
        } while (cVar2 != '/');
        goto LAB_0011fe99;
      }
      goto LAB_0011feac;
    }
    if ((cVar2 == '.') && ((pcVar3[1] == '\0' || ((pcVar3[1] == '.' && (pcVar3[2] == '\0')))))) {
      *pcVar3 = '\0';
      goto LAB_0011feb9;
    }
    do {
      *pcVar4 = cVar2;
      pcVar4 = pcVar4 + 1;
      cVar2 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
      if (cVar2 == '\0') break;
    } while (cVar2 != '/');
  } while( true );
}

Assistant:

static void
remove_dot_segments(char *inout)
{
	/* Windows backend protection
	 * (https://tools.ietf.org/html/rfc3986#section-7.3): Replace backslash
	 * in URI by slash */
	char *out_end = inout;
	char *in = inout;

	if (!in) {
		/* Param error. */
		return;
	}

	while (*in) {
		if (*in == '\\') {
			*in = '/';
		}
		in++;
	}

	/* Algorithm "remove_dot_segments" from
	 * https://tools.ietf.org/html/rfc3986#section-5.2.4 */
	/* Step 1:
	 * The input buffer is initialized.
	 * The output buffer is initialized to the empty string.
	 */
	in = inout;

	/* Step 2:
	 * While the input buffer is not empty, loop as follows:
	 */
	/* Less than out_end of the inout buffer is used as output, so keep
	 * condition: out_end <= in */
	while (*in) {
		/* Step 2a:
		 * If the input buffer begins with a prefix of "../" or "./",
		 * then remove that prefix from the input buffer;
		 */
		if (!strncmp(in, "../", 3)) {
			in += 3;
		} else if (!strncmp(in, "./", 2)) {
			in += 2;
		}
		/* otherwise */
		/* Step 2b:
		 * if the input buffer begins with a prefix of "/./" or "/.",
		 * where "." is a complete path segment, then replace that
		 * prefix with "/" in the input buffer;
		 */
		else if (!strncmp(in, "/./", 3)) {
			in += 2;
		} else if (!strcmp(in, "/.")) {
			in[1] = 0;
		}
		/* otherwise */
		/* Step 2c:
		 * if the input buffer begins with a prefix of "/../" or "/..",
		 * where ".." is a complete path segment, then replace that
		 * prefix with "/" in the input buffer and remove the last
		 * segment and its preceding "/" (if any) from the output
		 * buffer;
		 */
		else if (!strncmp(in, "/../", 4)) {
			in += 3;
			if (inout != out_end) {
				/* remove last segment */
				do {
					out_end--;
				} while ((inout != out_end) && (*out_end != '/'));
			}
		} else if (!strcmp(in, "/..")) {
			in[1] = 0;
			if (inout != out_end) {
				/* remove last segment */
				do {
					out_end--;
				} while ((inout != out_end) && (*out_end != '/'));
			}
		}
		/* otherwise */
		/* Step 2d:
		 * if the input buffer consists only of "." or "..", then remove
		 * that from the input buffer;
		 */
		else if (!strcmp(in, ".") || !strcmp(in, "..")) {
			*in = 0;
		}
		/* otherwise */
		/* Step 2e:
		 * move the first path segment in the input buffer to the end of
		 * the output buffer, including the initial "/" character (if
		 * any) and any subsequent characters up to, but not including,
		 * the next "/" character or the end of the input buffer.
		 */
		else {
			do {
				*out_end = *in;
				out_end++;
				in++;
			} while ((*in != 0) && (*in != '/'));
		}
	}

	/* Step 3:
	 * Finally, the output buffer is returned as the result of
	 * remove_dot_segments.
	 */
	/* Terminate output */
	*out_end = 0;

	/* For Windows, the files/folders "x" and "x." (with a dot but without
	 * extension) are identical. Replace all "./" by "/" and remove a "." at
	 * the end. Also replace all "//" by "/". Repeat until there is no "./"
	 * or "//" anymore.
	 */
	out_end = in = inout;
	while (*in) {
		if (*in == '.') {
			/* remove . at the end or preceding of / */
			char *in_ahead = in;
			do {
				in_ahead++;
			} while (*in_ahead == '.');
			if (*in_ahead == '/') {
				in = in_ahead;
				if ((out_end != inout) && (out_end[-1] == '/')) {
					/* remove generated // */
					out_end--;
				}
			} else if (*in_ahead == 0) {
				in = in_ahead;
			} else {
				do {
					*out_end++ = '.';
					in++;
				} while (in != in_ahead);
			}
		} else if (*in == '/') {
			/* replace // by / */
			*out_end++ = '/';
			do {
				in++;
			} while (*in == '/');
		} else {
			*out_end++ = *in;
			in++;
		}
	}
	*out_end = 0;
}